

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_atomize(char *expr,lys_node *cur_snode,lyxp_node_type cur_snode_type,lyxp_set *set,
                int options,lys_node **ctx_snode)

{
  lys_node *cur_node;
  int iVar1;
  int iVar2;
  lyxp_expr *exp;
  lys_module *plVar3;
  uint uVar4;
  lys_node *local_50;
  lys_node *_ctx_snode;
  lyxp_node_type local_3c;
  lyxp_node_type local_38;
  uint16_t local_32;
  lyxp_node_type ctx_snode_type;
  uint16_t exp_idx;
  
  local_32 = 0;
  _ctx_snode = (lys_node *)ctx_snode;
  local_3c = cur_snode_type;
  exp = lyxp_parse_expr(cur_snode->module->ctx,expr);
  iVar2 = -1;
  if (exp != (lyxp_expr *)0x0) {
    iVar1 = reparse_or_expr(cur_snode->module->ctx,exp,&local_32);
    if (iVar1 == 0) {
      if (local_32 < exp->used) {
        uVar4 = (uint)local_32;
        ly_vlog(cur_snode->module->ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar4 * 2)));
        iVar2 = -1;
        ly_vlog(cur_snode->module->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Unparsed characters \"%s\" left at the end of an XPath expression.",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar4 * 2)));
      }
      else {
        print_expr_struct_debug(exp);
        if ((options & 0x10U) == 0) {
          local_38 = local_3c;
          local_50 = cur_snode;
        }
        else {
          resolve_when_ctx_snode(cur_snode,&local_50,&local_38);
        }
        if (_ctx_snode != (lys_node *)0x0) {
          _ctx_snode->name = (char *)local_50;
        }
        local_32 = 0;
        *(undefined8 *)set = 0;
        *(undefined8 *)&set->field_0x8 = 0;
        set->ctx_pos = 0;
        set->ctx_size = 0;
        *(undefined8 *)&set->field_0x38 = 0;
        set->used = 0;
        set->size = 0;
        set->ht = (hash_table *)0x0;
        (set->val).nodes = (lyxp_set_node *)0x0;
        *(undefined8 *)((long)&set->val + 8) = 0;
        set->type = LYXP_SET_SNODE_SET;
        set_snode_insert_node(set,local_50,local_38);
        cur_node = local_50;
        plVar3 = lys_node_module(local_50);
        iVar2 = eval_expr_select(exp,&local_32,LYXP_EXPR_NONE,(lyd_node *)cur_node,plVar3,set,
                                 options);
        if (iVar2 == 2) {
          iVar2 = 0;
        }
      }
    }
  }
  lyxp_expr_free(exp);
  return iVar2;
}

Assistant:

int
lyxp_atomize(const char *expr, const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type,
             struct lyxp_set *set, int options, const struct lys_node **ctx_snode)
{
    struct lys_node *_ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    exp = lyxp_parse_expr(cur_snode->module->ctx, expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_or_expr(cur_snode->module->ctx, exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(cur_snode->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(cur_snode->module->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    if (options & LYXP_SNODE_WHEN) {
        /* for when the context node may need to be changed */
        resolve_when_ctx_snode(cur_snode, &_ctx_snode, &ctx_snode_type);
    } else {
        _ctx_snode = (struct lys_node *)cur_snode;
        ctx_snode_type = cur_snode_type;
    }

    if (ctx_snode) {
        *ctx_snode = _ctx_snode;
    }

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_SNODE_SET;
    set_snode_insert_node(set, _ctx_snode, ctx_snode_type);

    rc = eval_expr_select(exp, &exp_idx, 0, (struct lyd_node *)_ctx_snode, lys_node_module(_ctx_snode), set, options);
    if (rc == 2) {
        rc = EXIT_SUCCESS;
    }

finish:
    lyxp_expr_free(exp);
    return rc;
}